

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O1

bool __thiscall
Glucose::ClausesBuffer::getClause
          (ClausesBuffer *this,int threadId,int *threadOrigin,vec<Glucose::Lit> *resultClause,
          bool firstFound)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Lit local_3c;
  long local_38;
  
  puVar1 = (this->lastOfThread).data;
  local_38 = (long)threadId;
  uVar10 = puVar1[local_38];
  uVar6 = uVar10 + 1;
  uVar9 = this->first;
  uVar7 = this->maxsize;
  if (uVar6 == uVar7) {
    uVar6 = 0;
  }
  if (uVar6 == uVar9) {
    return false;
  }
  uVar6 = this->last;
  if (uVar6 <= uVar10 || uVar9 <= uVar6) {
    if ((uVar10 <= uVar9) || (uVar6 <= uVar10 && uVar9 <= uVar6)) goto LAB_0011a7a3;
  }
  uVar10 = uVar6;
LAB_0011a7a3:
  if (!firstFound) {
    uVar6 = 0;
    if (uVar10 + 1 != uVar7) {
      uVar6 = uVar10 + 1;
    }
    if (uVar6 != uVar9) {
      puVar2 = (this->elems).data;
      do {
        uVar5 = 0;
        if (uVar7 <= uVar10 + 3) {
          uVar5 = uVar7;
        }
        if (puVar2[(int)((uVar10 + 3) - uVar5)] != threadId) break;
        uVar10 = uVar10 + puVar2[(int)uVar6] + 3;
        uVar6 = 0;
        if (uVar7 <= uVar10) {
          uVar6 = uVar7;
        }
        uVar10 = uVar10 - uVar6;
        uVar6 = 0;
        if (uVar10 + 1 != uVar7) {
          uVar6 = uVar10 + 1;
        }
      } while (uVar6 != uVar9);
    }
  }
  uVar6 = uVar10 + 1;
  if (uVar6 == uVar7) {
    uVar6 = 0;
  }
  if (uVar6 == uVar9) {
    puVar1[local_38] = uVar10;
    bVar4 = false;
  }
  else {
    puVar1 = (this->elems).data;
    uVar9 = puVar1[(int)uVar6];
    if (uVar6 + 1 < uVar7) {
      uVar7 = 0;
    }
    iVar8 = (uVar6 - uVar7) + 1;
    uVar7 = puVar1[iVar8];
    puVar1[iVar8] = uVar7 - 1;
    uVar5 = 1;
    if (uVar6 + 1 != this->maxsize) {
      uVar5 = uVar6 + 2;
    }
    if (uVar5 == this->maxsize) {
      uVar5 = 0;
    }
    *threadOrigin = puVar1[(int)uVar5];
    if (resultClause->data != (Lit *)0x0) {
      resultClause->sz = 0;
    }
    if (0 < (int)uVar9) {
      do {
        uVar6 = uVar5 + 1;
        uVar5 = 0;
        if (uVar6 != this->maxsize) {
          uVar5 = uVar6;
        }
        local_3c.x = (this->elems).data[(int)uVar5];
        vec<Glucose::Lit>::push(resultClause,&local_3c);
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    lVar3 = local_38;
    if ((this->last == uVar10) && (uVar7 - 1 == 0)) {
      removeLastClause(this);
      uVar5 = this->last;
    }
    (this->lastOfThread).data[lVar3] = uVar5;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ClausesBuffer::getClause(int threadId, int & threadOrigin, vec<Lit> & resultClause,  bool firstFound) {
    assert(lastOfThread.size() > threadId);
    unsigned int thislast = lastOfThread[threadId];
    assert(!firstFound || thislast == last); // FIXME: Gilles has this assertion on his cluster

    // Early exiting
    if (nextIndex(thislast) == first) return false;

    if ( ( thislast < last && last < first) ||
	    ( first < thislast && thislast < last ) ||
	    ( last < first && first < thislast) ) {
	// Special case where last has moved and lastOfThread[threadId] is no more valid (is behind)
	thislast = last; 
    }
    assert(!firstFound);
    // Go to next clause for this thread id
    if (!firstFound) { 
	while (nextIndex(thislast) != first && elems[addIndex(thislast,3)] == ((unsigned int)threadId)) { // 3 = 2 + 1 
	    thislast = addIndex(thislast, elems[nextIndex(thislast)] + headerSize); // 
	    assert(thislast >= 0);
	    assert(thislast < maxsize);
	}
	assert(nextIndex(thislast)==first || elems[addIndex(thislast,3)] != (unsigned int)threadId);
    }

    if (nextIndex(thislast) == first) {
	lastOfThread[threadId] = thislast;
	return false;
    }  
    assert(elems[addIndex(thislast,3)] != ((unsigned int) threadId));
    unsigned int previouslast = thislast;
    bool removeAfter = false;
    int csize = noCheckPop(thislast);
    removeAfter = (--elems[addIndex(thislast,1)] == 0); // We are sure this is not one of our own clause
    thislast = nextIndex(thislast); // Skips the removeAfter fieldr
    threadOrigin = noCheckPop(thislast);
    assert(threadOrigin != threadId);
    resultClause.clear();
    for(int i=0;i<csize;i++) {
	resultClause.push(toLit(noCheckPop(thislast)));
    }
    if (last == previouslast && removeAfter) {
	removeLastClause();
	thislast = last;
    }
    lastOfThread[threadId] = thislast;
    return true;
}